

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

gs_val_t *
golf_script_eval_fn(gs_val_t *__return_storage_ptr__,golf_script_t *script,char *name,gs_val_t *args
                   ,int num_args)

{
  undefined8 *puVar1;
  vec_gs_env_t *data;
  int *length;
  gs_env_t **ppgVar2;
  map_base_t *m;
  map_node_t *pmVar3;
  undefined8 uVar4;
  int iVar5;
  map_base_t *m_00;
  long lVar6;
  map_node_t **ppmVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  
  m_00 = (map_base_t *)golf_alloc_tracked(0x38,"script/eval");
  m_00->buckets = (map_node_t **)0x0;
  m_00->nbuckets = 0;
  m_00->nnodes = 0;
  m_00[1].buckets = (map_node_t **)0x0;
  m_00[1].nbuckets = 0;
  m_00[1].nnodes = 0;
  m_00[2].buckets = (map_node_t **)0x0;
  m_00[2].nbuckets = 0;
  m_00[2].nnodes = 0;
  m_00[3].buckets = (map_node_t **)"script/eval";
  data = &(script->eval).env;
  length = &(script->eval).env.length;
  iVar5 = vec_expand_((char **)data,length,&(script->eval).env.capacity,8,
                      (script->eval).env.alloc_category);
  uVar8 = (script->eval).env.length;
  if (iVar5 == 0) {
    lVar6 = (long)(int)uVar8;
    ppgVar2 = data->data;
    uVar8 = uVar8 + 1;
    *length = uVar8;
    ppgVar2[lVar6] = (gs_env_t *)m_00;
  }
  uVar10 = (ulong)uVar8;
  do {
    if ((int)uVar10 < 1) goto LAB_00137e4b;
    m = (map_base_t *)data->data[uVar10 - 1];
    uVar10 = uVar10 - 1;
    ppmVar7 = (map_node_t **)map_get_(m,name);
    m[1].buckets = ppmVar7;
  } while (ppmVar7 == (map_node_t **)0x0);
  if (*(int *)ppmVar7 == 8) {
    pmVar3 = ppmVar7[1];
    if (*(int *)&pmVar3[1].next == num_args) {
      if (0 < num_args) {
        lVar6 = 0x10;
        uVar10 = 0;
        do {
          if (*(int *)(*(long *)(pmVar3 + 2) + uVar10 * 4) != *(int *)((long)args + lVar6 + -0x10))
          {
            pcVar9 = "Invalid arg type";
            goto LAB_00137e52;
          }
          puVar1 = (undefined8 *)((long)&args->type + lVar6);
          pcVar9 = *(char **)((long)pmVar3[2].value + lVar6);
          uVar4 = *puVar1;
          m_00[2].nbuckets = (int)uVar4;
          m_00[2].nnodes = (int)((ulong)uVar4 >> 0x20);
          uVar4 = puVar1[-2];
          ppmVar7 = (map_node_t **)puVar1[-1];
          m_00[1].nbuckets = (int)uVar4;
          m_00[1].nnodes = (int)((ulong)uVar4 >> 0x20);
          m_00[2].buckets = ppmVar7;
          map_set_(m_00,pcVar9,&m_00[1].nbuckets,0x18,(char *)m_00[3].buckets);
          uVar10 = uVar10 + 1;
          lVar6 = lVar6 + 0x18;
        } while ((uint)num_args != uVar10);
      }
      gs_eval_stmt(__return_storage_ptr__,&script->eval,(gs_stmt_t *)pmVar3[2].next);
      goto LAB_00137e60;
    }
    pcVar9 = "Invalid number of args";
  }
  else {
LAB_00137e4b:
    pcVar9 = "Could not find function";
  }
LAB_00137e52:
  gs_val_error(__return_storage_ptr__,pcVar9);
LAB_00137e60:
  *length = *length + -1;
  map_deinit_(m_00);
  golf_free_tracked(m_00);
  return __return_storage_ptr__;
}

Assistant:

gs_val_t golf_script_eval_fn(golf_script_t *script, const char *name, gs_val_t *args, int num_args) {
    gs_val_t val;
    gs_env_t *env = golf_alloc_tracked(sizeof(gs_env_t), "script/eval");
    map_init(&env->val_map, "script/eval");
    vec_push(&script->eval.env, env);

    gs_val_t fn_val;
    if (!golf_script_get_val(script, name, &fn_val) || fn_val.type != GS_VAL_FN) {
        val = gs_val_error("Could not find function");
        goto cleanup;
    }

    gs_stmt_t *fn_stmt = (gs_stmt_t*) fn_val.fn_stmt;
    if (num_args != fn_stmt->fn_decl.num_args) {
        val = gs_val_error("Invalid number of args");
        goto cleanup;
    }

    for (int i = 0; i < num_args; i++) {
        const char *symbol = fn_stmt->fn_decl.arg_symbols[i].symbol;
        gs_val_type type = fn_stmt->fn_decl.arg_types[i];
        if (type != args[i].type) {
            val = gs_val_error("Invalid arg type");
            goto cleanup;
        }
        map_set(&env->val_map, symbol, args[i]);
    }

    val = gs_eval_stmt(&script->eval, fn_stmt->fn_decl.body);

cleanup:
    (void)vec_pop(&script->eval.env);
    map_deinit(&env->val_map);
    golf_free(env);
    return val;
}